

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void array_container_printf(array_container_t *v)

{
  int *in_RDI;
  int i;
  int local_c;
  
  if (*in_RDI == 0) {
    printf("{}");
  }
  else {
    printf("{");
    printf("%d",(ulong)**(ushort **)(in_RDI + 2));
    for (local_c = 1; local_c < *in_RDI; local_c = local_c + 1) {
      printf(",%d",(ulong)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_c * 2));
    }
    printf("}");
  }
  return;
}

Assistant:

void array_container_printf(const array_container_t *v) {
    if (v->cardinality == 0) {
        printf("{}");
        return;
    }
    printf("{");
    printf("%d", v->array[0]);
    for (int i = 1; i < v->cardinality; ++i) {
        printf(",%d", v->array[i]);
    }
    printf("}");
}